

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O2

void Txs3_ManCollectCone_rec(Txs3_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  uint uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t **ppVVar4;
  
  if (pObj->Value == 0xffffffff) {
    return;
  }
  pObj->Value = 0xffffffff;
  uVar1 = (uint)*(undefined8 *)pObj;
  if ((~uVar1 & 0x9fffffff) == 0) {
    pGVar3 = p->pGia;
    iVar2 = Gia_ObjCioId(pObj);
    if (iVar2 < pGVar3->vCis->nSize - pGVar3->nRegs) {
      pGVar3 = p->pGia;
      ppVVar4 = &p->vCiObjs;
    }
    else {
      iVar2 = Gia_ObjCioId(pObj);
      iVar2 = Vec_IntEntry(p->vPrio,(iVar2 - p->pGia->vCis->nSize) + p->pGia->nRegs);
      pGVar3 = p->pGia;
      if (iVar2 == 0) {
        ppVVar4 = &p->vFosAbs;
      }
      else {
        ppVVar4 = &p->vFosPre;
      }
    }
  }
  else {
    if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                    ,0x87,"void Txs3_ManCollectCone_rec(Txs3_Man_t *, Gia_Obj_t *)");
    }
    Txs3_ManCollectCone_rec(p,pObj + -(ulong)(uVar1 & 0x1fffffff));
    Txs3_ManCollectCone_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    pGVar3 = p->pGia;
    ppVVar4 = &p->vNodes;
  }
  p_00 = *ppVVar4;
  iVar2 = Gia_ObjId(pGVar3,pObj);
  Vec_IntPush(p_00,iVar2);
  return;
}

Assistant:

void Txs3_ManCollectCone_rec( Txs3_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !~pObj->Value )
        return;
    pObj->Value = ~0;
    if ( Gia_ObjIsCi(pObj) )
    {
        int Entry;
        if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            Vec_IntPush( p->vCiObjs, Gia_ObjId(p->pGia, pObj) );
            return;
        }
        Entry = Gia_ObjCioId(pObj) - Gia_ManPiNum(p->pGia);
        if ( Vec_IntEntry(p->vPrio, Entry) ) // present flop
            Vec_IntPush( p->vFosPre, Gia_ObjId(p->pGia, pObj) );
        else // asbstracted flop
            Vec_IntPush( p->vFosAbs, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Txs3_ManCollectCone_rec( p, Gia_ObjFanin0(pObj) );
    Txs3_ManCollectCone_rec( p, Gia_ObjFanin1(pObj) );
    Vec_IntPush( p->vNodes, Gia_ObjId(p->pGia, pObj) );
}